

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakWarningGlobalDetectorTest_turnOffNewOverloadsNoThrowCausesNoAdditionalLeaks_TestShell
::
~TEST_MemoryLeakWarningGlobalDetectorTest_turnOffNewOverloadsNoThrowCausesNoAdditionalLeaks_TestShell
          (TEST_MemoryLeakWarningGlobalDetectorTest_turnOffNewOverloadsNoThrowCausesNoAdditionalLeaks_TestShell
           *this)

{
  TEST_MemoryLeakWarningGlobalDetectorTest_turnOffNewOverloadsNoThrowCausesNoAdditionalLeaks_TestShell
  *this_local;
  
  ~TEST_MemoryLeakWarningGlobalDetectorTest_turnOffNewOverloadsNoThrowCausesNoAdditionalLeaks_TestShell
            (this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MemoryLeakWarningGlobalDetectorTest, turnOffNewOverloadsNoThrowCausesNoAdditionalLeaks)
{
#undef new
    size_t storedAmountOfLeaks = detector->totalMemoryLeaks(mem_leak_period_all);

    char* nonMemoryNoThrow = new (std::nothrow) char;
    char* nonArrayMemoryNoThrow = new (std::nothrow) char[10];
    char* nonArrayMemoryThrow = new char[10];

    LONGS_EQUAL(storedAmountOfLeaks, detector->totalMemoryLeaks(mem_leak_period_all));

    ::operator delete(nonMemoryNoThrow, std::nothrow);
    ::operator delete[](nonArrayMemoryNoThrow, std::nothrow);
    ::operator delete[](nonArrayMemoryThrow, std::nothrow);
#ifdef CPPUTEST_USE_NEW_MACROS
    #include "CppUTest/MemoryLeakDetectorNewMacros.h"
#endif
}